

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lprowsetbase.h
# Opt level: O3

int __thiscall soplex::LPRowSetBase<double>::remove(LPRowSetBase<double> *this,char *__filename)

{
  int iVar1;
  pointer pdVar2;
  int *piVar3;
  int extraout_EAX;
  int iVar4;
  DataKey local_30;
  
  iVar4 = (int)__filename;
  local_30 = (this->super_SVSetBase<double>).set.thekey[iVar4];
  SVSetBase<double>::remove(&this->super_SVSetBase<double>,(char *)&local_30);
  iVar1 = (this->super_SVSetBase<double>).set.thenum;
  pdVar2 = (this->left).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar2[iVar4] = pdVar2[iVar1];
  pdVar2 = (this->right).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar2[iVar4] = pdVar2[iVar1];
  pdVar2 = (this->object).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar2[iVar4] = pdVar2[iVar1];
  piVar3 = (this->scaleExp).data;
  piVar3[iVar4] = piVar3[iVar1];
  VectorBase<double>::reDim(&this->left,(this->super_SVSetBase<double>).set.thenum,true);
  VectorBase<double>::reDim(&this->right,(this->super_SVSetBase<double>).set.thenum,true);
  VectorBase<double>::reDim(&this->object,(this->super_SVSetBase<double>).set.thenum,true);
  DataArray<int>::reSize(&this->scaleExp,(this->super_SVSetBase<double>).set.thenum);
  return extraout_EAX;
}

Assistant:

void remove(int i)
   {
      SVSetBase<R>::remove(i);
      left[i] = left[num()];
      right[i] = right[num()];
      object[i] = object[num()];
      scaleExp[i] = scaleExp[num()];
      left.reDim(num());
      right.reDim(num());
      object.reDim(num());
      scaleExp.reSize(num());
   }